

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-defend.c
# Opt level: O1

_Bool borg_defend(wchar_t p1)

{
  _Bool _Var1;
  wchar_t wVar2;
  wchar_t wVar3;
  char *pcVar4;
  ulong uVar5;
  wchar_t what;
  
  borg_simulate = true;
  if ((borg.resistance != 0) && ((int)borg.resistance < borg_game_ratio * 2)) {
    borg_attacking = true;
    wVar2 = borg_danger(borg.c.y,borg.c.x,L'\x01',false,false);
    borg_attacking = false;
    if ((((int)(uint)borg_fear_region[borg.c.y / 0xb][borg.c.x / 0xb] < wVar2) ||
        (borg_fighting_unique != L'\0')) && (_Var1 = borg_spell(RESISTANCE), _Var1)) {
      pcVar4 = format("# Refreshing Resistance.  borg.resistance=%d, player->=%d, (ratio=%d)",
                      (ulong)(uint)(int)borg.resistance,(ulong)(uint)(int)player->timed[0x13],
                      (ulong)(uint)(int)borg_game_ratio);
      borg_note(pcVar4);
      borg_attempting_refresh_resist = true;
      borg.resistance = 25000;
      return true;
    }
  }
  what = L'\0';
  uVar5 = 0xffffffff;
  wVar2 = L'\0';
  do {
    wVar3 = borg_calculate_defense_effectiveness(what,p1);
    if (wVar2 < wVar3) {
      uVar5 = (ulong)(uint)what;
      wVar2 = wVar3;
    }
    what = what + L'\x01';
  } while (what != L' ');
  if (L'\0' < wVar2) {
    pcVar4 = format("# Performing defense type %d with value %d",uVar5,(ulong)(uint)wVar2);
    borg_note(pcVar4);
    borg_simulate = false;
    borg_calculate_defense_effectiveness((wchar_t)uVar5,p1);
    return true;
  }
  return false;
}

Assistant:

bool borg_defend(int p1)
{
    int n, b_n = 0;
    int g, b_g = -1;

    /* Simulate */
    borg_simulate = true;

    /* if you have Resist All and it is about to drop, */
    /* refresh it (if you can) */
    if (borg.resistance && borg.resistance < (borg_game_ratio * 2)) {
        int p;

        /* check 'true' danger. This will make sure we do not */
        /* refresh our Resistance if no-one is around */
        borg_attacking = true;
        p              = borg_danger(
            borg.c.y, borg.c.x, 1, false, false); /* Note false for danger!! */
        borg_attacking = false;
        if (p > borg_fear_region[borg.c.y / 11][borg.c.x / 11]
            || borg_fighting_unique) {
            if (borg_spell(RESISTANCE)) {
                borg_note(format("# Refreshing Resistance.  "
                                 "borg.resistance=%d, player->=%d, (ratio=%d)",
                    borg.resistance, player->timed[TMD_OPP_ACID],
                    borg_game_ratio));
                borg_attempting_refresh_resist = true;
                borg.resistance                = 25000;
                return true;
            }
        }
    }

    /* Analyze the possible setup moves */
    for (g = 0; g < BD_MAX; g++) {
        /* Simulate */
        n = borg_calculate_defense_effectiveness(g, p1);

        /* Track "best" attack */
        if (n <= b_n)
            continue;

        /* Track best */
        b_g = g;
        b_n = n;
    }

    /* Nothing good */
    if (b_n <= 0) {
        return false;
    }

    /* Note */
    borg_note(format("# Performing defense type %d with value %d", b_g, b_n));

    /* Instantiate */
    borg_simulate = false;

    /* Instantiate */
    (void)borg_calculate_defense_effectiveness(b_g, p1);

    /* Success */
    return true;
}